

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profit.c
# Opt level: O0

bool_t prf_init(void)

{
  void *unaff_retaddr;
  _func_void_int_int_char_ptr_void_ptr *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  
  prf_messages_init();
  prf_messages_add_handler(in_stack_00000014,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  pool_system_init();
  prf_nodeinfo_init();
  return 1;
}

Assistant:

bool_t
prf_init(
    void )
{
    assert( prf_endianness_verification() && "invalid endianness setting" );
    prf_messages_init();
#ifndef NDEBUG
    /* configure these for level-of-verboseness during debugging */
    prf_messages_add_handler( PRF_MSG_DEBUG,  3, profit_debug, NULL );
    prf_messages_add_handler( PRF_MSG_WARNING, 3, profit_warning, NULL );
#endif /* ! NDEBUG */
    prf_messages_add_handler( PRF_MSG_ERROR, 1, profit_error, NULL );
    pool_system_init();
    prf_nodeinfo_init();
    return TRUE;
}